

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

void __thiscall
wallet::LegacyScriptPubKeyMan::AddKeypoolPubkeyWithDB
          (LegacyScriptPubKeyMan *this,CPubKey *pubkey,bool internal,WalletBatch *batch)

{
  int64_t iVar1;
  bool bVar2;
  mapped_type *pmVar3;
  runtime_error *this_00;
  _Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *this_01;
  long lVar4;
  long in_FS_OFFSET;
  allocator<char> local_b9;
  int64_t index;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  CKeyPool local_80;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock43,
             &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x560,false);
  lVar4 = (this->super_LegacyDataSPKM).m_max_keypool_index;
  if (lVar4 == 0x7fffffffffffffff) {
    __assert_fail("m_max_keypool_index < std::numeric_limits<int64_t>::max()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x561,
                  "void wallet::LegacyScriptPubKeyMan::AddKeypoolPubkeyWithDB(const CPubKey &, const bool, WalletBatch &)"
                 );
  }
  lVar4 = lVar4 + 1;
  (this->super_LegacyDataSPKM).m_max_keypool_index = lVar4;
  index = lVar4;
  CKeyPool::CKeyPool(&local_80,pubkey,internal);
  bVar2 = WalletBatch::WritePool(batch,lVar4,&local_80);
  if (bVar2) {
    this_01 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
              &(this->super_LegacyDataSPKM).setExternalKeyPool;
    if (internal) {
      this_01 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                &(this->super_LegacyDataSPKM).setInternalKeyPool;
    }
    std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
    _M_insert_unique<long_const&>(this_01,&index);
    iVar1 = index;
    CPubKey::GetID((CKeyID *)&local_80,pubkey);
    pmVar3 = std::
             map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::
             operator[](&(this->super_LegacyDataSPKM).m_pool_key_to_index,(key_type *)&local_80);
    *pmVar3 = iVar1;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"AddKeypoolPubkeyWithDB",&local_b9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                   &local_a0,": writing imported pubkey failed");
    std::runtime_error::runtime_error(this_00,(string *)&local_80);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::AddKeypoolPubkeyWithDB(const CPubKey& pubkey, const bool internal, WalletBatch& batch)
{
    LOCK(cs_KeyStore);
    assert(m_max_keypool_index < std::numeric_limits<int64_t>::max()); // How in the hell did you use so many keys?
    int64_t index = ++m_max_keypool_index;
    if (!batch.WritePool(index, CKeyPool(pubkey, internal))) {
        throw std::runtime_error(std::string(__func__) + ": writing imported pubkey failed");
    }
    if (internal) {
        setInternalKeyPool.insert(index);
    } else {
        setExternalKeyPool.insert(index);
    }
    m_pool_key_to_index[pubkey.GetID()] = index;
}